

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utXImporterExporter.cpp
# Opt level: O1

void __thiscall
utXImporterExporter_heap_overflow_in_tokenizer_Test::TestBody
          (utXImporterExporter_heap_overflow_in_tokenizer_Test *this)

{
  bool bVar1;
  Importer importer;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  AssertHelper local_18;
  Importer local_10;
  
  Assimp::Importer::Importer(&local_10);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      Assimp::Importer::ReadFile
                (&local_10,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/X/OV_GetNextToken"
                 ,0);
    }
  }
  else {
    testing::Message::Message((Message *)&local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utXImporterExporter.cpp"
               ,0x44,
               "Expected: importer.ReadFile( \"/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models\" \"/X/OV_GetNextToken\", 0 ) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_18,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    if (local_20.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_20.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_20.ptr_ + 8))();
      }
      local_20.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  Assimp::Importer::~Importer(&local_10);
  return;
}

Assistant:

TEST_F( utXImporterExporter, heap_overflow_in_tokenizer ) {
    Assimp::Importer importer;
    EXPECT_NO_THROW( importer.ReadFile( ASSIMP_TEST_MODELS_DIR "/X/OV_GetNextToken", 0 ) );
}